

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VClone(N_Vector W,sunindextype param_2,int myid)

{
  int iVar1;
  N_Vector X;
  long lVar2;
  char *__s;
  long lVar3;
  double dVar4;
  timespec spec;
  timespec local_40;
  
  if (W->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) {
    printf(">>> FAILED test -- N_VClone, Proc %d missing required operations\n",(ulong)(uint)myid);
  }
  else {
    clock_gettime(1,&local_40);
    lVar3 = local_40.tv_sec - base_time_tv_sec;
    dVar4 = (double)local_40.tv_nsec;
    X = (N_Vector)N_VClone(W);
    clock_gettime(1,&local_40);
    if (X == (N_Vector)0x0) {
      printf(">>> FAILED test -- N_VClone, Proc %d \n",(ulong)(uint)myid);
      puts("    After N_VClone, X == NULL \n");
      return 1;
    }
    lVar2 = local_40.tv_sec - base_time_tv_sec;
    iVar1 = has_data(X);
    if (iVar1 == 0) {
      printf(">>> FAILED test -- N_VClone, Proc %d \n",(ulong)(uint)myid);
      __s = "    Vector data == NULL \n";
    }
    else {
      N_VConst(0x3ff0000000000000,X);
      iVar1 = check_ans(1.0,X,param_2);
      if (iVar1 == 0) {
        N_VDestroy(X);
        if (myid == 0) {
          puts("PASSED test -- N_VClone ");
        }
        max_time(W,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar2) -
                   (dVar4 / 1000000000.0 + (double)lVar3));
        if (print_time == 0) {
          return 0;
        }
        printf("%s Time: %22.15e\n\n","N_VClone");
        return 0;
      }
      printf(">>> FAILED test -- N_VClone, Proc %d \n",(ulong)(uint)myid);
      __s = "    Failed N_VClone check \n";
    }
    puts(__s);
    N_VDestroy(X);
  }
  return 1;
}

Assistant:

int Test_N_VClone(N_Vector W, sunindextype local_length, int myid)
{
  int failure;
  double start_time, stop_time, maxt;
  N_Vector X;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL)
  {
    printf(">>> FAILED test -- N_VClone, Proc %d missing required operations\n",
           myid);
    return (1);
  }

  /* clone vector */
  start_time = get_time();
  X          = N_VClone(W);
  stop_time  = get_time();

  /* check cloned vector */
  if (X == NULL)
  {
    printf(">>> FAILED test -- N_VClone, Proc %d \n", myid);
    printf("    After N_VClone, X == NULL \n\n");
    return (1);
  }

  /* check cloned vector data */
  if (!has_data(X))
  {
    printf(">>> FAILED test -- N_VClone, Proc %d \n", myid);
    printf("    Vector data == NULL \n\n");
    N_VDestroy(X);
    return (1);
  }

  N_VConst(ONE, X);
  failure = check_ans(ONE, X, local_length);
  if (failure)
  {
    printf(">>> FAILED test -- N_VClone, Proc %d \n", myid);
    printf("    Failed N_VClone check \n\n");
    N_VDestroy(X);
    return (1);
  }
  N_VDestroy(X);

  if (myid == 0) { printf("PASSED test -- N_VClone \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VClone", maxt);

  return (0);
}